

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardwarex.cpp
# Opt level: O0

int StopOtherScanThreadRPLIDARx(RPLIDAR *pRPLIDAR)

{
  int local_1c;
  int id;
  RPLIDAR *pRPLIDAR_local;
  
  local_1c = 0;
  do {
    if ((RPLIDAR *)addrsRPLIDAR[local_1c] == pRPLIDAR) {
      bExitOtherScanRPLIDAR[local_1c] = 1;
      WaitForThread(RPLIDAROtherScanThreadId[local_1c]);
      DeleteCriticalSection(RPLIDARCS + local_1c);
      resRPLIDAR[local_1c] = 1;
      return 0;
    }
    local_1c = local_1c + 1;
  } while (local_1c < 0x10);
  return 1;
}

Assistant:

HARDWAREX_API int StopOtherScanThreadRPLIDARx(RPLIDAR* pRPLIDAR)
{
	int id = 0;

	while (addrsRPLIDAR[id] != pRPLIDAR)
	{
		id++;
		if (id >= MAX_NB_DEVICES_HARDWAREX) return EXIT_FAILURE;
	}

	bExitOtherScanRPLIDAR[id] = TRUE;
	WaitForThread(RPLIDAROtherScanThreadId[id]);
	DeleteCriticalSection(&RPLIDARCS[id]);
	resRPLIDAR[id] = EXIT_FAILURE;
	return EXIT_SUCCESS;
}